

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostip.c
# Opt level: O0

int Curl_resolv(connectdata *conn,char *hostname,int port,Curl_dns_entry **entry)

{
  _Bool _Var1;
  int local_54;
  Curl_addrinfo *pCStack_50;
  int respwait;
  Curl_addrinfo *addr;
  int rc;
  CURLcode result;
  SessionHandle *data;
  Curl_dns_entry *dns;
  Curl_dns_entry **entry_local;
  char *pcStack_20;
  int port_local;
  char *hostname_local;
  connectdata *conn_local;
  
  data = (SessionHandle *)0x0;
  _rc = conn->data;
  addr._0_4_ = -1;
  *entry = (Curl_dns_entry *)0x0;
  dns = (Curl_dns_entry *)entry;
  entry_local._4_4_ = port;
  pcStack_20 = hostname;
  hostname_local = (char *)conn;
  if (_rc->share != (Curl_share *)0x0) {
    Curl_share_lock(_rc,CURL_LOCK_DATA_DNS,CURL_LOCK_ACCESS_SINGLE);
  }
  data = (SessionHandle *)fetch_addr((connectdata *)hostname_local,pcStack_20,entry_local._4_4_);
  if (data != (SessionHandle *)0x0) {
    Curl_infof(_rc,"Hostname %s was found in DNS cache\n",pcStack_20);
    data->easy_conn = (connectdata *)((long)&data->easy_conn->data + 1);
    addr._0_4_ = 0;
  }
  if (_rc->share != (Curl_share *)0x0) {
    Curl_share_unlock(_rc,CURL_LOCK_DATA_DNS);
  }
  if (data == (SessionHandle *)0x0) {
    _Var1 = Curl_ipvalid((connectdata *)hostname_local);
    if (!_Var1) {
      return -1;
    }
    pCStack_50 = Curl_getaddrinfo((connectdata *)hostname_local,pcStack_20,entry_local._4_4_,
                                  &local_54);
    if (pCStack_50 == (Curl_addrinfo *)0x0) {
      if (local_54 != 0) {
        return -1;
      }
    }
    else {
      if (_rc->share != (Curl_share *)0x0) {
        Curl_share_lock(_rc,CURL_LOCK_DATA_DNS,CURL_LOCK_ACCESS_SINGLE);
      }
      data = (SessionHandle *)Curl_cache_addr(_rc,pCStack_50,pcStack_20,entry_local._4_4_);
      if (_rc->share != (Curl_share *)0x0) {
        Curl_share_unlock(_rc,CURL_LOCK_DATA_DNS);
      }
      if (data == (SessionHandle *)0x0) {
        Curl_freeaddrinfo(pCStack_50);
      }
      else {
        addr._0_4_ = 0;
      }
    }
  }
  dns->addr = (Curl_addrinfo *)data;
  return (int)addr;
}

Assistant:

int Curl_resolv(struct connectdata *conn,
                const char *hostname,
                int port,
                struct Curl_dns_entry **entry)
{
  struct Curl_dns_entry *dns = NULL;
  struct SessionHandle *data = conn->data;
  CURLcode result;
  int rc = CURLRESOLV_ERROR; /* default to failure */

  *entry = NULL;

  if(data->share)
    Curl_share_lock(data, CURL_LOCK_DATA_DNS, CURL_LOCK_ACCESS_SINGLE);

  dns = fetch_addr(conn, hostname, port);

  if(dns) {
    infof(data, "Hostname %s was found in DNS cache\n", hostname);
    dns->inuse++; /* we use it! */
    rc = CURLRESOLV_RESOLVED;
  }

  if(data->share)
    Curl_share_unlock(data, CURL_LOCK_DATA_DNS);

  if(!dns) {
    /* The entry was not in the cache. Resolve it to IP address */

    Curl_addrinfo *addr;
    int respwait;

    /* Check what IP specifics the app has requested and if we can provide it.
     * If not, bail out. */
    if(!Curl_ipvalid(conn))
      return CURLRESOLV_ERROR;

    /* If Curl_getaddrinfo() returns NULL, 'respwait' might be set to a
       non-zero value indicating that we need to wait for the response to the
       resolve call */
    addr = Curl_getaddrinfo(conn,
#ifdef DEBUGBUILD
                            (data->set.str[STRING_DEVICE]
                             && !strcmp(data->set.str[STRING_DEVICE],
                                        "LocalHost"))?"localhost":
#endif
                            hostname, port, &respwait);

    if(!addr) {
      if(respwait) {
        /* the response to our resolve call will come asynchronously at
           a later time, good or bad */
        /* First, check that we haven't received the info by now */
        result = Curl_resolver_is_resolved(conn, &dns);
        if(result) /* error detected */
          return CURLRESOLV_ERROR;
        if(dns)
          rc = CURLRESOLV_RESOLVED; /* pointer provided */
        else
          rc = CURLRESOLV_PENDING; /* no info yet */
      }
    }
    else {
      if(data->share)
        Curl_share_lock(data, CURL_LOCK_DATA_DNS, CURL_LOCK_ACCESS_SINGLE);

      /* we got a response, store it in the cache */
      dns = Curl_cache_addr(data, addr, hostname, port);

      if(data->share)
        Curl_share_unlock(data, CURL_LOCK_DATA_DNS);

      if(!dns)
        /* returned failure, bail out nicely */
        Curl_freeaddrinfo(addr);
      else
        rc = CURLRESOLV_RESOLVED;
    }
  }

  *entry = dns;

  return rc;
}